

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_boolean(int boolean)

{
  JSON_Value *new_value;
  JSON_Value *pJStack_10;
  int boolean_local;
  
  pJStack_10 = (JSON_Value *)(*parson_malloc)(0x20);
  if (pJStack_10 == (JSON_Value *)0x0) {
    pJStack_10 = (JSON_Value *)0x0;
  }
  else {
    pJStack_10->parent = (JSON_Value *)0x0;
    pJStack_10->type = 6;
    *(uint *)&pJStack_10->value = (uint)(boolean != 0);
  }
  return pJStack_10;
}

Assistant:

JSON_Value * json_value_init_boolean(int boolean) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONBoolean;
    new_value->value.boolean = boolean ? 1 : 0;
    return new_value;
}